

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O0

int scep_conf_init(char *filename)

{
  int iVar1;
  CONF_METHOD *meth;
  CONF *conf_00;
  scep_engine_conf_st *psVar2;
  CONF *conf;
  long err;
  char *filename_local;
  
  if (filename != (char *)0x0) {
    err = (long)filename;
    meth = NCONF_default();
    conf_00 = (CONF *)NCONF_new(meth);
    iVar1 = NCONF_load((CONF *)conf_00,(char *)err,(long *)&conf);
    if (iVar1 == 0) {
      if (conf == (CONF *)0x0) {
        fprintf(_stderr,"%s: Error opening configuration file\n",pname);
      }
      else {
        fprintf(_stderr,"%s: Error in %s on line %li\n",pname,err,conf);
        ERR_print_errors_fp(_stderr);
      }
      exit(0x5d);
    }
    scep_conf = (SCEP_CONF *)malloc(0x10);
    psVar2 = (scep_engine_conf_st *)malloc(0x58);
    scep_conf->engine = psVar2;
    scep_conf->engine_str = (char *)0x0;
    scep_conf_load(conf_00);
  }
  return 0;
}

Assistant:

int scep_conf_init(char *filename) {
    long err;
    CONF *conf;

    if(filename == NULL) {
        return 0;
    }
    conf = NCONF_new(NCONF_default());
    if(!NCONF_load(conf, filename, &err)) {
        if(err == 0)
            fprintf(stderr, "%s: Error opening configuration file\n", pname);
        else {
            fprintf(stderr, "%s: Error in %s on line %li\n", pname, filename, err);
            ERR_print_errors_fp(stderr);
        }
        exit(SCEP_PKISTATUS_FILE);
    }

    scep_conf = malloc(sizeof(*scep_conf));
    scep_conf->engine = malloc(sizeof(struct scep_engine_conf_st));
    scep_conf->engine_str = NULL;
    if(scep_conf_load(conf) == 0 && v_flag) {
        //report something here?
    }
    return 0;
}